

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O2

bool __thiscall DOMTest::treeCompare(DOMTest *this,DOMNode *node,DOMNode *node2)

{
  bool bVar1;
  int iVar2;
  DOMNode *node_00;
  DOMNode *node2_00;
  long lVar3;
  DOMNode *node_01;
  DOMNode *node2_01;
  wchar16 *pwVar4;
  wchar16 *pwVar5;
  
  node_00 = (DOMNode *)(**(code **)(*(long *)node + 0x38))(node);
  node2_00 = (DOMNode *)(**(code **)(*(long *)node2 + 0x38))(node2);
  if (node2_00 == (DOMNode *)0x0 || node_00 == (DOMNode *)0x0) {
    if (node_00 != node2_00) {
      return false;
    }
  }
  else {
    bVar1 = treeCompare(this,node_00,node2_00);
    if (!bVar1) {
      return false;
    }
    lVar3 = (**(code **)(*(long *)node_00 + 0x50))(node_00);
    if ((lVar3 == 0) || (lVar3 = (**(code **)(*(long *)node2_00 + 0x50))(node2_00), lVar3 == 0)) {
      lVar3 = (**(code **)(*(long *)node_00 + 0x50))(node_00);
      if (lVar3 != 0) {
        return false;
      }
      lVar3 = (**(code **)(*(long *)node2_00 + 0x50))(node2_00);
      if (lVar3 != 0) {
        return false;
      }
    }
    else {
      while ((lVar3 = (**(code **)(*(long *)node_00 + 0x50))(node_00), lVar3 != 0 &&
             (lVar3 = (**(code **)(*(long *)node2_00 + 0x50))(node2_00), lVar3 != 0))) {
        node_01 = (DOMNode *)(**(code **)(*(long *)node_00 + 0x50))(node_00);
        node2_01 = (DOMNode *)(**(code **)(*(long *)node2_00 + 0x50))(node2_00);
        bVar1 = treeCompare(this,node_01,node2_01);
        if (!bVar1) {
          return false;
        }
        node_00 = (DOMNode *)(**(code **)(*(long *)node_00 + 0x50))(node_00);
        node2_00 = (DOMNode *)(**(code **)(*(long *)node2_00 + 0x50))(node2_00);
      }
    }
  }
  pwVar4 = (wchar16 *)(**(code **)(*(long *)node + 0x10))(node);
  pwVar5 = (wchar16 *)(**(code **)(*(long *)node2 + 0x10))(node2);
  iVar2 = xercesc_4_0::XMLString::compareString(pwVar4,pwVar5);
  if (((iVar2 == 0) &&
      ((lVar3 = (**(code **)(*(long *)node + 0x18))(node), lVar3 != 0 ||
       (lVar3 = (**(code **)(*(long *)node2 + 0x18))(node2), lVar3 == 0)))) &&
     ((lVar3 = (**(code **)(*(long *)node + 0x18))(node), lVar3 == 0 ||
      (lVar3 = (**(code **)(*(long *)node2 + 0x18))(node2), lVar3 != 0)))) {
    pwVar4 = (wchar16 *)(**(code **)(*(long *)node + 0x18))(node);
    pwVar5 = (wchar16 *)(**(code **)(*(long *)node2 + 0x18))(node2);
    iVar2 = xercesc_4_0::XMLString::compareString(pwVar4,pwVar5);
    return iVar2 == 0;
  }
  return false;
}

Assistant:

bool DOMTest::treeCompare(DOMNode* node, DOMNode* node2)
{
    bool answer = true;

    DOMNode*  kid, *kid2;         // Check the subtree for equality
    kid = node->getFirstChild();
    kid2 = node2->getFirstChild();
    if (kid && kid2)
    {
        answer = treeCompare(kid, kid2);
        if (!answer)
            return answer;
        else
            if (kid->getNextSibling() && kid2->getNextSibling())
            {
                while (kid->getNextSibling() && kid2->getNextSibling())
                {
                    answer = treeCompare(kid->getNextSibling(), kid2->getNextSibling());
                    if (!answer)
                        return answer;
                    else
                    {
                        kid = kid->getNextSibling();
                        kid2 = kid2->getNextSibling();
                    }
                }
            } else
                if (!(!kid->getNextSibling() && !kid2->getNextSibling()))
                {
                    return false;
                }
    } else
        if (kid != kid2)
        {
            // One or the other of (kid1, kid2) is 0, but not both.
            return false;
        }

    if (XMLString::compareString(node->getNodeName(), node2->getNodeName()))
        return false;
    if (node->getNodeValue()==0 && node2->getNodeValue()!=0)
        return false;
    if (node->getNodeValue()!=0 && node2->getNodeValue()==0)
        return false;
    if (XMLString::compareString(node->getNodeValue(), node2->getNodeValue()))
        return false;

    return answer;
}